

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,Publication *publication)

{
  string sStack_38;
  
  ChannelUri::addSessionId(&sStack_38,&publication->m_channel,publication->m_sessionId);
  stopRecording(this,&sStack_38,publication->m_streamId);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void AeronArchive::stopRecording(const aeron::Publication& publication) {
    const std::string& recordingChannel = ChannelUri::addSessionId(publication.channel(), publication.sessionId());

    stopRecording(recordingChannel, publication.streamId());
}